

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParallelDescriptor.cpp
# Opt level: O2

void amrex::ParallelDescriptor::ReadAndBcastFile
               (string *filename,Vector<char,_std::allocator<char>_> *charBuf,bool bExitOnError,
               MPI_Comm *comm)

{
  long lVar1;
  Vector<char,_std::allocator<char>_> io_buffer;
  ifstream iss;
  long local_218 [2];
  int aiStack_208 [122];
  
  std::vector<char,_std::allocator<char>_>::vector
            (&io_buffer.super_vector<char,_std::allocator<char>_>,0x200000,(allocator_type *)&iss);
  std::ifstream::ifstream(&iss);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    (**(code **)(local_218[0] + 0x18))
              (local_218,
               io_buffer.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    std::ifstream::open((char *)&iss,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)((long)aiStack_208 + *(long *)(_iss + -0x18)) != 0) {
      if (!bExitOnError) goto LAB_004f907e;
      FileOpenFailed(filename);
      goto LAB_004f9044;
    }
    std::istream::seekg((long)&iss,_S_beg);
    lVar1 = std::istream::tellg();
    std::istream::seekg((long)&iss,_S_beg);
    if (lVar1 == -1) goto LAB_004f907e;
  }
  else {
LAB_004f9044:
    lVar1 = 0;
  }
  std::vector<char,_std::allocator<char>_>::resize
            (&charBuf->super_vector<char,_std::allocator<char>_>,lVar1 + 1);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::istream::read((char *)&iss,
                       (long)(charBuf->super_vector<char,_std::allocator<char>_>).
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    std::ifstream::close();
  }
  (charBuf->super_vector<char,_std::allocator<char>_>).
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start[lVar1] =
       '\0';
LAB_004f907e:
  std::ifstream::~ifstream(&iss);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
  return;
}

Assistant:

void
ReadAndBcastFile (const std::string& filename, Vector<char>& charBuf,
                  bool bExitOnError, const MPI_Comm&comm)
{
    enum { IO_Buffer_Size = 262144 * 8 };

#ifdef BL_SETBUF_SIGNED_CHAR
    typedef signed char Setbuf_Char_Type;
#else
    typedef char Setbuf_Char_Type;
#endif

    Vector<Setbuf_Char_Type> io_buffer(IO_Buffer_Size);

    Long fileLength(0), fileLengthPadded(0);

    std::ifstream iss;

    if (ParallelDescriptor::IOProcessor()) {
        iss.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        iss.open(filename.c_str(), std::ios::in);
        if ( ! iss.good()) {
          if(bExitOnError) {
            amrex::FileOpenFailed(filename);
          } else {
            fileLength = -1;
          }
        } else {
          iss.seekg(0, std::ios::end);
          fileLength = static_cast<std::streamoff>(iss.tellg());
          iss.seekg(0, std::ios::beg);
        }
    }
    ParallelDescriptor::Bcast(&fileLength, 1,
                              ParallelDescriptor::IOProcessorNumber(), comm);

    if(fileLength == -1) {
      return;
    }

    fileLengthPadded = fileLength + 1;
//    fileLengthPadded += fileLengthPadded % 8;
    charBuf.resize(fileLengthPadded);
    if (ParallelDescriptor::IOProcessor()) {
        iss.read(charBuf.dataPtr(), fileLength);
        iss.close();
    }
    ParallelDescriptor::Bcast(charBuf.dataPtr(), fileLengthPadded,
                              ParallelDescriptor::IOProcessorNumber(), comm);
    charBuf[fileLength] = '\0';
}